

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

void __thiscall GLRParser::toDot(GLRParser *this,string *filename)

{
  Production *this_00;
  pointer pbVar1;
  string *label;
  string *psVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  pointer pbVar8;
  string stateTo;
  string stateLable;
  allocator<char> local_30c;
  allocator<char> local_30b;
  allocator<char> local_30a;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  string *local_2a0;
  _Base_ptr local_298;
  _Base_ptr local_290;
  string local_288;
  Graph local_268;
  string local_210;
  Connection local_1f0;
  Node local_190;
  Connection local_110;
  Node local_b0;
  
  local_268.rankdir._M_dataplus._M_p = (pointer)&local_268.rankdir.field_2;
  local_268.rankdir._M_string_length = 0;
  local_268.rankdir.field_2._8_8_ = 0;
  local_268.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_268.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.rankdir.field_2._M_allocated_capacity = 0;
  local_2a0 = filename;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"TB",(allocator<char> *)&local_300);
  Graph::setRankdir(&local_268,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  local_298 = &(this->states)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var7 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var7 != local_298) {
    local_308 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(p_Var7 + 1);
    std::operator+(&local_300,"{",local_308);
    local_290 = p_Var7;
    std::operator+(&local_2e0,&local_300,"|");
    std::__cxx11::string::~string((string *)&local_300);
    p_Var5 = (_Rb_tree_node_base *)local_308[3].field_2._M_allocated_capacity;
    p_Var6 = (_Rb_tree_node_base *)(local_308 + 3);
    bVar3 = true;
    while (p_Var5 != p_Var6) {
      this_00 = *(Production **)(p_Var5 + 1);
      if (!bVar3) {
        std::__cxx11::string::append((char *)&local_2e0);
      }
      Production::getFromP_abi_cxx11_(this_00);
      std::__cxx11::string::append((string *)&local_2e0);
      std::__cxx11::string::append((char *)&local_2e0);
      pvVar4 = Production::getToP_abi_cxx11_(this_00);
      pbVar1 = (pvVar4->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (pvVar4->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
          pbVar8 = pbVar8 + 1) {
        std::__cxx11::string::append((string *)&local_2e0);
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      bVar3 = false;
    }
    if (*(char *)&local_308[1]._M_dataplus._M_p != '\0') {
      std::__cxx11::string::append((char *)&local_2e0);
    }
    std::__cxx11::string::append((char *)&local_2e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"Mrecord",(allocator<char> *)&local_2c0);
    Node::Node(&local_b0,local_308,&local_2e0,&local_300);
    Graph::addNode(&local_268,&local_b0);
    Node::~Node(&local_b0);
    std::__cxx11::string::~string((string *)&local_300);
    psVar2 = local_308 + 4;
    for (p_Var6 = (_Rb_tree_node_base *)local_308[5]._M_dataplus._M_p;
        p_Var6 != (_Rb_tree_node_base *)&psVar2->field_2;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      label = *(string **)(p_Var6 + 1);
      std::__cxx11::string::string((string *)&local_300,(string *)label[1]._M_dataplus._M_p);
      Connection::Connection(&local_110,local_308,&local_300,label);
      Graph::addConnection(&local_268,&local_110);
      Connection::~Connection(&local_110);
      std::__cxx11::string::~string((string *)&local_300);
    }
    std::__cxx11::string::~string((string *)&local_2e0);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_290);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"invis",&local_30c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"invis",&local_309);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"circle",&local_30a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"style=invis",&local_30b);
  Node::Node(&local_190,&local_2e0,&local_300,&local_2c0,&local_288);
  Graph::addNode(&local_268,&local_190);
  Node::~Node(&local_190);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"invis",(allocator<char> *)&local_288);
  startStateName_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Start",&local_30c);
  Connection::Connection(&local_1f0,&local_2e0,&local_300,&local_2c0);
  Graph::addConnection(&local_268,&local_1f0);
  Connection::~Connection(&local_1f0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::string((string *)&local_210,(string *)local_2a0);
  Graph::build_file(&local_268,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  Graph::~Graph(&local_268);
  return;
}

Assistant:

void GLRParser::toDot(std::string filename) {
    Graph graph = Graph();
    graph.setRankdir("TB");
    for (auto state: states) {
        // TODO: getProductions()
        std::string stateLable = "{" + state->getName() + "|";
        bool firstElem = true;
        for (auto prod: state->getProductions()) {
            if (!firstElem) { stateLable += "\\n"; }
            firstElem = false;

            stateLable += prod->getFromP();
            stateLable += " -\\> ";
            for (const auto &el: prod->getToP()) {
                stateLable += el;
            }
        }

        if (state->isAccepting()) {
            stateLable += "|accepting state";
        }

        stateLable += "}";
        graph.addNode(Node(state->getName(), stateLable, "Mrecord"));

        for (auto transition: state->getStatesTo()) {
            const std::string &connectionString = transition->getLabel();
            std::string stateTo = transition->getStateTo()->getName();
            graph.addConnection(Connection(state->getName(), stateTo,
                                           connectionString));
        }
    }


    graph.addNode(Node("invis", "invis", "circle", "style=invis"));
    graph.addConnection(Connection("invis", startStateName(), "Start"));
    graph.build_file(std::move(filename));
}